

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void __thiscall absl::lts_20250127::synchronization_internal::GraphCycles::Rep::Rep(Rep *this)

{
  (this->nodes_).ptr_ = (this->nodes_).space_;
  (this->nodes_).size_ = 0;
  (this->nodes_).capacity_ = 8;
  (this->free_nodes_).ptr_ = (this->free_nodes_).space_;
  (this->free_nodes_).size_ = 0;
  (this->free_nodes_).capacity_ = 8;
  (this->ptrmap_).nodes_ = &this->nodes_;
  memset(&(this->ptrmap_).table_,0xff,0xfffec);
  (this->deltaf_).ptr_ = (this->deltaf_).space_;
  (this->deltaf_).size_ = 0;
  (this->deltaf_).capacity_ = 8;
  (this->deltab_).ptr_ = (this->deltab_).space_;
  (this->deltab_).size_ = 0;
  (this->deltab_).capacity_ = 8;
  (this->list_).ptr_ = (this->list_).space_;
  (this->list_).size_ = 0;
  (this->list_).capacity_ = 8;
  (this->merged_).ptr_ = (this->merged_).space_;
  (this->merged_).size_ = 0;
  (this->merged_).capacity_ = 8;
  (this->stack_).ptr_ = (this->stack_).space_;
  (this->stack_).size_ = 0;
  (this->stack_).capacity_ = 8;
  return;
}

Assistant:

Rep() : ptrmap_(&nodes_) {}